

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O1

Curl_tree * Curl_splay(timeval i,Curl_tree *t)

{
  long lVar1;
  Curl_tree *pCVar2;
  ulong uVar3;
  Curl_tree *pCVar4;
  Curl_tree *pCVar5;
  long lVar6;
  long lVar7;
  Curl_tree *pCVar8;
  Curl_tree N;
  
  lVar6 = i.tv_usec;
  lVar7 = i.tv_sec;
  if (t == (Curl_tree *)0x0) {
    return (Curl_tree *)0x0;
  }
  pCVar5 = &N;
  N.smaller = (Curl_tree *)0x0;
  N.larger = (Curl_tree *)0x0;
  pCVar8 = pCVar5;
  do {
    uVar3 = 0xffffffffffffffff;
    lVar1 = (t->key).tv_sec;
    if ((lVar1 <= lVar7) && (uVar3 = 1, lVar7 <= lVar1)) {
      uVar3 = 0xffffffffffffffff;
      lVar1 = (t->key).tv_usec;
      if (lVar1 <= lVar6) {
        uVar3 = (ulong)(lVar1 < lVar6);
      }
    }
    if ((long)uVar3 < 0) {
      pCVar2 = t->smaller;
      if (pCVar2 == (Curl_tree *)0x0) {
LAB_00131b58:
        pCVar5->larger = t->smaller;
        pCVar8->smaller = t->larger;
        t->smaller = N.larger;
        t->larger = N.smaller;
        return t;
      }
      lVar1 = (pCVar2->key).tv_sec;
      if ((lVar7 < lVar1) || ((lVar7 <= lVar1 && (lVar6 < (pCVar2->key).tv_usec)))) {
        t->smaller = pCVar2->larger;
        pCVar2->larger = t;
        t = pCVar2;
        if (pCVar2->smaller == (Curl_tree *)0x0) goto LAB_00131b58;
      }
      pCVar8->smaller = t;
      pCVar8 = t;
    }
    else {
      if ((uVar3 == 0) || (pCVar2 = t->larger, pCVar2 == (Curl_tree *)0x0)) goto LAB_00131b58;
      lVar1 = (pCVar2->key).tv_sec;
      pCVar4 = t;
      if ((lVar1 <= lVar7) && ((lVar1 < lVar7 || ((pCVar2->key).tv_usec < lVar6)))) {
        t->larger = pCVar2->smaller;
        pCVar2->smaller = t;
        pCVar4 = pCVar2;
        t = pCVar2;
        if (pCVar2->larger == (Curl_tree *)0x0) goto LAB_00131b58;
      }
      pCVar5->larger = pCVar4;
      t = (Curl_tree *)&pCVar4->larger;
      pCVar5 = pCVar4;
    }
    t = t->smaller;
  } while( true );
}

Assistant:

struct Curl_tree *Curl_splay(struct timeval i,
                             struct Curl_tree *t)
{
  struct Curl_tree N, *l, *r, *y;
  long comp;

  if(t == NULL)
    return t;
  N.smaller = N.larger = NULL;
  l = r = &N;

  for(;;) {
    comp = compare(i, t->key);
    if(comp < 0) {
      if(t->smaller == NULL)
        break;
      if(compare(i, t->smaller->key) < 0) {
        y = t->smaller;                           /* rotate smaller */
        t->smaller = y->larger;
        y->larger = t;
        t = y;
        if(t->smaller == NULL)
          break;
      }
      r->smaller = t;                               /* link smaller */
      r = t;
      t = t->smaller;
    }
    else if(comp > 0) {
      if(t->larger == NULL)
        break;
      if(compare(i, t->larger->key) > 0) {
        y = t->larger;                          /* rotate larger */
        t->larger = y->smaller;
        y->smaller = t;
        t = y;
        if(t->larger == NULL)
          break;
      }
      l->larger = t;                              /* link larger */
      l = t;
      t = t->larger;
    }
    else
      break;
  }

  l->larger = t->smaller;                                /* assemble */
  r->smaller = t->larger;
  t->smaller = N.larger;
  t->larger = N.smaller;

  return t;
}